

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppillr.cpp
# Opt level: O3

void __thiscall KeywordStats::print(KeywordStats *this)

{
  long lVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    lVar1 = *(long *)((long)(this->keywords)._M_elems + lVar2);
    if (lVar1 != 0) {
      printf("%d\t%s\n",lVar1,
             *(undefined8 *)
              ((long)&((keywords_id_abi_cxx11_.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar2 * 4));
    }
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x288);
  return;
}

Assistant:

void print() {
    for (int i=0; i<int(MaxKeyword); ++i) {
      if (keywords[i] > 0)
        std::printf("%d\t%s\n", keywords[i], keywords_id[i].c_str());
    }
  }